

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O0

void FAudio_INTERNAL_MixCallback(void *userdata,Uint8 *stream,int len)

{
  int in_EDX;
  undefined8 in_RSI;
  FAudio *in_RDI;
  FAudio *audio;
  float *in_stack_ffffffffffffffd8;
  
  SDL_memset(in_RSI,0,(long)in_EDX);
  if (in_RDI->active != '\0') {
    FAudio_INTERNAL_UpdateEngine(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void FAudio_INTERNAL_MixCallback(void *userdata, Uint8 *stream, int len)
{
	FAudio *audio = (FAudio*) userdata;

	FAudio_zero(stream, len);
	if (audio->active)
	{
		FAudio_INTERNAL_UpdateEngine(
			audio,
			(float*) stream
		);
	}
}